

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolicyPureVector.cpp
# Opt level: O1

void __thiscall PolicyPureVector::SetDepth(PolicyPureVector *this,size_t d)

{
  long *plVar1;
  size_type __new_size;
  long lVar2;
  
  *(size_t *)&this->field_0x8 = d;
  lVar2 = *(long *)&this->field_0x18;
  if (lVar2 == 0) {
    lVar2 = *(long *)&this->field_0x20;
  }
  plVar1 = (long *)__dynamic_cast(lVar2,&Interface_ProblemToPolicyDiscrete::typeinfo,
                                  &Interface_ProblemToPolicyDiscretePure::typeinfo,0);
  __new_size = (**(code **)(*plVar1 + 0x28))
                         (plVar1,this->_m_agentI,*(undefined4 *)&this->field_0x30,d);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->_m_domainToActionIndices,__new_size);
  return;
}

Assistant:

void PolicyPureVector::SetDepth(size_t d)
{
    Policy::SetDepth(d);
    _m_domainToActionIndices.resize(
        GetInterfacePTPDiscretePure()->GetNrPolicyDomainElements(
            _m_agentI,
            GetPolicyDomainCategory(),
            d));
}